

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.hpp
# Opt level: O3

int __thiscall
soplex::
SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectLeave(SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *val,
             number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *enterTest,bool polish)

{
  undefined1 *this_00;
  uint *puVar1;
  double dVar2;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *upd;
  int *idx;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *upp;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *low;
  pointer pBVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  pointer pnVar8;
  pointer pnVar9;
  element_type *peVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined1 auVar16 [16];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar17;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pLVar18;
  BreakpointSource BVar19;
  BreakpointSource BVar20;
  int32_t iVar21;
  type_conflict5 tVar22;
  bool bVar23;
  int iVar24;
  int iVar25;
  fpclass_type fVar26;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar27;
  long lVar28;
  uint uVar29;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar30;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar31;
  uint uVar32;
  ulong uVar33;
  int nBp;
  int local_5d8;
  uint local_5d4;
  int leaveIdx;
  uint local_5cc;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lowstab;
  int minIdx;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<50U,_int,_void> local_518;
  cpp_dec_float<50U,_int,_void> local_4d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_498;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_490;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  cpp_dec_float<50U,_int,_void> local_448;
  SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_410;
  SPxId baseId;
  BreakpointCompare local_400;
  cpp_dec_float<50U,_int,_void> local_3f8;
  uint local_3b8 [12];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  stab;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_228;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  iVar24 = ((this->
            super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .thesolver)->enterCount;
  if ((iVar24 * -0x3d70a3d7 + 0x51eb850U >> 2 | iVar24 * 0x40000000) < 0x28f5c29) {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              ((cpp_dec_float<50U,_int,_void> *)
               &(this->
                super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).field_0x114,1);
  }
  if ((((polish) ||
       ((this->
        super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).field_0x111 != '\x01')) ||
      ((this->
       super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).field_0x112 != '\x01')) ||
     (pSVar27 = (this->
                super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .thesolver, pSVar27->theRep == COLUMN)) {
LAB_002de426:
    local_68.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((enterTest->m_backend).data._M_elems + 8);
    pnVar30 = &local_68;
    local_68.m_backend.data._M_elems._0_8_ = *(undefined8 *)(enterTest->m_backend).data._M_elems;
    local_68.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((enterTest->m_backend).data._M_elems + 2);
    local_68.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((enterTest->m_backend).data._M_elems + 4);
    local_68.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((enterTest->m_backend).data._M_elems + 6);
    local_68.m_backend.exp = (enterTest->m_backend).exp;
    local_68.m_backend.neg = (enterTest->m_backend).neg;
    local_68.m_backend.fpclass = (enterTest->m_backend).fpclass;
    local_68.m_backend.prec_elem = (enterTest->m_backend).prec_elem;
    goto LAB_002de468;
  }
  this_00 = &(this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).field_0x114;
  local_498 = enterTest;
  if (*(int *)&this->field_0x144 != 2) {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&lowstab.m_backend,0,(type *)0x0);
    iVar24 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       ((cpp_dec_float<50U,_int,_void> *)this_00,&lowstab.m_backend);
    enterTest = local_498;
    if (iVar24 < 1) goto LAB_002de426;
    pSVar27 = (this->
              super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .thesolver;
  }
  pUVar3 = pSVar27->theFvec;
  pnVar30 = (pUVar3->
            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  upd = (pUVar3->thedelta).
        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .val.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  idx = (pUVar3->thedelta).super_IdxSet.idx;
  iVar24 = (pUVar3->thedelta).super_IdxSet.num;
  upp = (pSVar27->theUBbound).val.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  low = (pSVar27->theLBbound).val.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  local_4d8.fpclass = cpp_dec_float_finite;
  local_4d8.prec_elem = 10;
  local_4d8.data._M_elems[0] = 0;
  local_4d8.data._M_elems[1] = 0;
  local_4d8.data._M_elems[2] = 0;
  local_4d8.data._M_elems[3] = 0;
  local_4d8.data._M_elems[4] = 0;
  local_4d8.data._M_elems[5] = 0;
  local_4d8.data._M_elems[6] = 0;
  local_4d8.data._M_elems[7] = 0;
  local_4d8.data._M_elems[8] = 0;
  local_4d8.data._M_elems[9] = 0;
  local_4d8.exp = 0;
  local_4d8.neg = false;
  leaveIdx = -1;
  local_3f8.fpclass = cpp_dec_float_finite;
  local_3f8.prec_elem = 10;
  local_3f8.data._M_elems[0] = 0;
  local_3f8.data._M_elems[1] = 0;
  local_3f8.data._M_elems[2] = 0;
  local_3f8.data._M_elems[3] = 0;
  local_3f8.data._M_elems[4] = 0;
  local_3f8.data._M_elems[5] = 0;
  local_3f8.data._M_elems[6] = 0;
  local_3f8.data._M_elems[7] = 0;
  local_3f8.data._M_elems[8] = 0;
  local_3f8.data._M_elems[9] = 0;
  local_3f8.exp = 0;
  local_3f8.neg = false;
  local_3b8[8] = 0;
  local_3b8[9] = 0;
  local_3b8[4] = 0;
  local_3b8[5] = 0;
  local_3b8[6] = 0;
  local_3b8[7] = 0;
  local_3b8[0] = 0;
  local_3b8[1] = 0;
  local_3b8[2] = 0;
  local_3b8[3] = 0;
  stab.m_backend.fpclass = cpp_dec_float_finite;
  stab.m_backend.prec_elem = 10;
  stab.m_backend.data._M_elems[0] = 0;
  stab.m_backend.data._M_elems[1] = 0;
  stab.m_backend.data._M_elems[2] = 0;
  stab.m_backend.data._M_elems[3] = 0;
  stab.m_backend.data._M_elems[4] = 0;
  stab.m_backend.data._M_elems[5] = 0;
  stab.m_backend.data._M_elems._24_5_ = 0;
  stab.m_backend.data._M_elems[7]._1_3_ = 0;
  stab.m_backend.data._M_elems._32_5_ = 0;
  stab.m_backend.data._M_elems[9]._1_3_ = 0;
  stab.m_backend.exp = 0;
  stab.m_backend.neg = false;
  local_518.data._M_elems._32_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 8);
  local_518.data._M_elems._0_8_ = *(undefined8 *)(val->m_backend).data._M_elems;
  local_518.data._M_elems._8_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 2);
  local_518.data._M_elems._16_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 4);
  local_518.data._M_elems._24_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 6);
  local_518.exp = (val->m_backend).exp;
  local_518.neg = (val->m_backend).neg;
  local_518.fpclass = (val->m_backend).fpclass;
  local_518.prec_elem = (val->m_backend).prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)val,0.0);
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_4d8,0.0);
  nBp = 0;
  minIdx = -1;
  if (local_518.fpclass == cpp_dec_float_NaN) {
LAB_002de68c:
    collectBreakpointsMin(this,&nBp,&minIdx,idx,iVar24,upd,pnVar30,upp,low,FVEC);
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&lowstab.m_backend,0,(type *)0x0);
    iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_518,&lowstab.m_backend);
    if (iVar25 < 1) goto LAB_002de68c;
    collectBreakpointsMax(this,&nBp,&minIdx,idx,iVar24,upd,pnVar30,upp,low,FVEC);
  }
  if (nBp == 0) {
    *(undefined8 *)((val->m_backend).data._M_elems + 8) = local_518.data._M_elems._32_8_;
    *(undefined8 *)((val->m_backend).data._M_elems + 4) = local_518.data._M_elems._16_8_;
    *(undefined8 *)((val->m_backend).data._M_elems + 6) = local_518.data._M_elems._24_8_;
    *(undefined8 *)(val->m_backend).data._M_elems = local_518.data._M_elems._0_8_;
    *(undefined8 *)((val->m_backend).data._M_elems + 2) = local_518.data._M_elems._8_8_;
    (val->m_backend).exp = local_518.exp;
    (val->m_backend).neg = local_518.neg;
    (val->m_backend).fpclass = local_518.fpclass;
    (val->m_backend).prec_elem = local_518.prec_elem;
    return leaveIdx;
  }
  lVar28 = (long)minIdx;
  pBVar4 = (this->breakpoints).data.
           super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = *(undefined8 *)((long)&pBVar4[lVar28].val.m_backend + 0x20);
  uVar11 = *(undefined8 *)&pBVar4[lVar28].val;
  uVar12 = *(undefined8 *)((long)&pBVar4[lVar28].val + 8);
  uVar13 = *(undefined8 *)((long)&pBVar4[lVar28].val.m_backend + 0x10);
  uVar14 = *(undefined8 *)((long)&pBVar4[lVar28].val.m_backend + 0x18);
  iVar24 = *(int *)((long)&pBVar4[lVar28].val.m_backend + 0x28);
  bVar23 = *(bool *)((long)&pBVar4[lVar28].val.m_backend + 0x2c);
  iVar25 = pBVar4[lVar28].idx;
  BVar20 = pBVar4[lVar28].src;
  *(undefined8 *)((long)&pBVar4[lVar28].val.m_backend + 0x20) =
       *(undefined8 *)((long)&(pBVar4->val).m_backend + 0x20);
  uVar6 = *(undefined8 *)((long)&(pBVar4->val).m_backend + 8);
  uVar7 = *(undefined8 *)((long)&(pBVar4->val).m_backend + 0x10);
  uVar15 = *(undefined8 *)((long)&(pBVar4->val).m_backend + 0x18);
  *(undefined8 *)&pBVar4[lVar28].val = *(undefined8 *)&(pBVar4->val).m_backend;
  *(undefined8 *)((long)&pBVar4[lVar28].val + 8) = uVar6;
  *(undefined8 *)((long)&pBVar4[lVar28].val.m_backend + 0x10) = uVar7;
  *(undefined8 *)((long)&pBVar4[lVar28].val.m_backend + 0x18) = uVar15;
  *(int *)((long)&pBVar4[lVar28].val.m_backend + 0x28) =
       *(int *)((long)&(pBVar4->val).m_backend + 0x28);
  *(bool *)((long)&pBVar4[lVar28].val.m_backend + 0x2c) =
       *(bool *)((long)&(pBVar4->val).m_backend + 0x2c);
  uVar6 = *(undefined8 *)((long)&(pBVar4->val).m_backend + 0x30);
  BVar19 = pBVar4->src;
  pBVar4[lVar28].idx = pBVar4->idx;
  pBVar4[lVar28].src = BVar19;
  uVar7 = *(undefined8 *)((long)&pBVar4[lVar28].val.m_backend + 0x30);
  *(undefined8 *)((long)&pBVar4[lVar28].val.m_backend + 0x30) = uVar6;
  pBVar4 = (this->breakpoints).data.
           super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)((long)&(pBVar4->val).m_backend + 0x20) = uVar5;
  *(undefined8 *)((long)&(pBVar4->val).m_backend + 0x10) = uVar13;
  *(undefined8 *)((long)&(pBVar4->val).m_backend + 0x18) = uVar14;
  *(undefined8 *)&(pBVar4->val).m_backend = uVar11;
  *(undefined8 *)((long)&(pBVar4->val).m_backend + 8) = uVar12;
  *(int *)((long)&(pBVar4->val).m_backend + 0x28) = iVar24;
  *(bool *)((long)&(pBVar4->val).m_backend + 0x2c) = bVar23;
  *(undefined8 *)((long)&(pBVar4->val).m_backend + 0x30) = uVar7;
  pBVar4->idx = iVar25;
  pBVar4->src = BVar20;
  local_3f8.data._M_elems[0] = (local_498->m_backend).data._M_elems[0];
  local_3f8.exp = (local_498->m_backend).exp;
  local_3f8.neg = (local_498->m_backend).neg;
  local_3f8.fpclass = (local_498->m_backend).fpclass;
  local_3f8.prec_elem = (local_498->m_backend).prec_elem;
  if (local_3f8.neg == true) {
    local_3f8.neg = local_3f8.fpclass == 0 && local_3f8.data._M_elems[0] == 0;
  }
  uVar5 = *(undefined8 *)((local_498->m_backend).data._M_elems + 1);
  uVar6 = *(undefined8 *)((local_498->m_backend).data._M_elems + 3);
  uVar7 = *(undefined8 *)((local_498->m_backend).data._M_elems + 5);
  uVar11 = *(undefined8 *)((local_498->m_backend).data._M_elems + 7);
  local_3f8.data._M_elems[1] = (uint)uVar5;
  local_3f8.data._M_elems[2] = (uint)((ulong)uVar5 >> 0x20);
  local_3f8.data._M_elems[3] = (uint)uVar6;
  local_3f8.data._M_elems[4] = (uint)((ulong)uVar6 >> 0x20);
  local_3f8.data._M_elems[5] = (uint)uVar7;
  local_3f8.data._M_elems[6] = (uint)((ulong)uVar7 >> 0x20);
  local_3f8.data._M_elems[7] = (uint)uVar11;
  local_3f8.data._M_elems[8] = (uint)((ulong)uVar11 >> 0x20);
  local_3f8.data._M_elems[9] = (local_498->m_backend).data._M_elems[9];
  auVar16._12_4_ = 0;
  auVar16._0_4_ = lowstab.m_backend.data._M_elems[1];
  auVar16._4_4_ = lowstab.m_backend.data._M_elems[2];
  auVar16._8_4_ = lowstab.m_backend.data._M_elems[3];
  lowstab.m_backend.data._M_elems._0_16_ = auVar16 << 0x20;
  tVar22 = boost::multiprecision::operator==
                     ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&local_3f8,(int *)&lowstab);
  if (tVar22) {
    pSVar27 = (this->
              super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .thesolver;
    uVar5 = *(undefined8 *)((pSVar27->instableEnterVal).m_backend.data._M_elems + 8);
    local_3f8.data._M_elems[8] = (uint)uVar5;
    local_3f8.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
    uVar5 = *(undefined8 *)(pSVar27->instableEnterVal).m_backend.data._M_elems;
    uVar6 = *(undefined8 *)((pSVar27->instableEnterVal).m_backend.data._M_elems + 2);
    uVar7 = *(undefined8 *)((pSVar27->instableEnterVal).m_backend.data._M_elems + 4);
    uVar11 = *(undefined8 *)((pSVar27->instableEnterVal).m_backend.data._M_elems + 6);
    local_3f8.data._M_elems[4] = (uint)uVar7;
    local_3f8.data._M_elems[5] = (uint)((ulong)uVar7 >> 0x20);
    local_3f8.data._M_elems[6] = (uint)uVar11;
    local_3f8.data._M_elems[7] = (uint)((ulong)uVar11 >> 0x20);
    local_3f8.data._M_elems[0] = (uint)uVar5;
    local_3f8.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
    local_3f8.data._M_elems[2] = (uint)uVar6;
    local_3f8.data._M_elems[3] = (uint)((ulong)uVar6 >> 0x20);
    local_3f8.exp = (pSVar27->instableEnterVal).m_backend.exp;
    local_3f8.neg = (pSVar27->instableEnterVal).m_backend.neg;
    uVar33._0_4_ = (pSVar27->instableEnterVal).m_backend.fpclass;
    uVar33._4_4_ = (pSVar27->instableEnterVal).m_backend.prec_elem;
    local_3f8._48_8_ = uVar33;
  }
  else {
    uVar33 = local_3f8._48_8_ & 0xffffffff;
  }
  fVar26 = (fpclass_type)uVar33;
  local_400.entry =
       (this->breakpoints).data.
       super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
       ._M_impl.super__Vector_impl_data._M_start;
  uVar32 = 0;
  if (nBp < 1) {
    local_5d8 = 0;
  }
  else {
    local_5d8 = 0;
    uVar32 = 0;
    if (fVar26 != cpp_dec_float_NaN) {
      uVar32 = 0;
      lVar28 = 0x38;
      local_5d8 = 0;
      local_410 = this;
      while( true ) {
        this = local_410;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&lowstab.m_backend,0,(type *)0x0);
        iVar24 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_3f8,&lowstab.m_backend);
        if (iVar24 < 1) break;
        if (local_5d8 < (int)uVar32) {
          local_5d8 = SPxQuicksortPart<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::Breakpoint,soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::BreakpointCompare>
                                ((this->breakpoints).data.
                                 super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                                 ._M_impl.super__Vector_impl_data._M_start,&local_400,local_5d8 + 1,
                                 nBp,4,0,0,true);
        }
        iVar24 = *(int *)((long)&(((this->breakpoints).data.
                                   super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->val).m_backend +
                         lVar28);
        lowstab.m_backend.exp = upd[iVar24].m_backend.exp;
        lowstab.m_backend.neg = upd[iVar24].m_backend.neg;
        lowstab.m_backend.fpclass = upd[iVar24].m_backend.fpclass;
        lowstab.m_backend.prec_elem = upd[iVar24].m_backend.prec_elem;
        puVar1 = upd[iVar24].m_backend.data._M_elems + 4;
        lowstab.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        uVar6 = *(undefined8 *)(puVar1 + 2);
        uVar5 = *(undefined8 *)(upd[iVar24].m_backend.data._M_elems + 8);
        lowstab.m_backend.data._M_elems._32_5_ = SUB85(uVar5,0);
        lowstab.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
        lowstab.m_backend.data._M_elems._24_5_ = SUB85(uVar6,0);
        lowstab.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        if ((lowstab.m_backend.neg == true) &&
           (lowstab.m_backend.data._M_elems[0] =
                 (uint)*(undefined8 *)upd[iVar24].m_backend.data._M_elems,
           lowstab.m_backend.fpclass != cpp_dec_float_finite ||
           lowstab.m_backend.data._M_elems[0] != 0)) {
          lowstab.m_backend.neg = false;
        }
        pSVar27 = (this->
                  super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .thesolver;
        baseId.super_DataKey =
             (pSVar27->
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).theBaseId.data[iVar24].super_DataKey;
        if (baseId.super_DataKey.info < 1) {
          pLVar18 = &(pSVar27->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ;
        }
        else {
          pLVar18 = (LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)&(pSVar27->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ;
        }
        lowstab.m_backend.data._M_elems._0_16_ =
             *(undefined1 (*) [16])upd[iVar24].m_backend.data._M_elems;
        iVar24 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                 ::number(&(pLVar18->
                           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).set,&baseId.super_DataKey);
        pSVar27 = (this->
                  super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .thesolver;
        pLVar18 = &(pSVar27->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ;
        if (0 < baseId.super_DataKey.info) {
          pLVar18 = (LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)&(pSVar27->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ;
        }
        pnVar8 = (pLVar18->right).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        result_1.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar8[iVar24].m_backend.data;
        result_1.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((long)&pnVar8[iVar24].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar8[iVar24].m_backend.data + 0x10);
        result_1.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        result_1.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        local_448.data._M_elems._24_5_ = result_1.m_backend.data._M_elems._24_5_;
        local_448.data._M_elems[7]._1_3_ = result_1.m_backend.data._M_elems[7]._1_3_;
        result_1.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((long)&pnVar8[iVar24].m_backend.data + 0x20);
        local_448.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
        local_448.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
        result_1.m_backend.exp = pnVar8[iVar24].m_backend.exp;
        result_1.m_backend.neg = pnVar8[iVar24].m_backend.neg;
        pLVar18 = (LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)&(pSVar27->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ;
        if (baseId.super_DataKey.info < 1) {
          pLVar18 = &(pSVar27->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ;
        }
        pnVar9 = (pLVar18->left).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        result_1.m_backend.fpclass = pnVar8[iVar24].m_backend.fpclass;
        result_1.m_backend.prec_elem = pnVar8[iVar24].m_backend.prec_elem;
        uVar7 = *(undefined8 *)&pnVar9[iVar24].m_backend.data;
        uVar11 = *(undefined8 *)((long)&pnVar9[iVar24].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar9[iVar24].m_backend.data + 0x10);
        uVar12 = *(undefined8 *)puVar1;
        uVar13 = *(undefined8 *)(puVar1 + 2);
        uVar5 = *(undefined8 *)((long)&pnVar9[iVar24].m_backend.data + 0x20);
        iVar25 = pnVar9[iVar24].m_backend.exp;
        bVar23 = pnVar9[iVar24].m_backend.neg;
        uVar6._0_4_ = pnVar9[iVar24].m_backend.fpclass;
        uVar6._4_4_ = pnVar9[iVar24].m_backend.prec_elem;
        local_448.data._M_elems._0_8_ = result_1.m_backend.data._M_elems._0_8_;
        local_448.data._M_elems._8_8_ = result_1.m_backend.data._M_elems._8_8_;
        local_448.data._M_elems._16_8_ = result_1.m_backend.data._M_elems._16_8_;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&result_1.m_backend,&lowstab.m_backend);
        result_2.m_backend.data._M_elems[8] = (uint)uVar5;
        result_2.m_backend.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
        result_2.m_backend.data._M_elems[4] = (uint)uVar12;
        result_2.m_backend.data._M_elems[5] = (uint)((ulong)uVar12 >> 0x20);
        result_2.m_backend.data._M_elems[6] = (uint)uVar13;
        result_2.m_backend.data._M_elems[7] = (uint)((ulong)uVar13 >> 0x20);
        result_2.m_backend.data._M_elems[0] = (uint)uVar7;
        result_2.m_backend.data._M_elems[1] = (uint)((ulong)uVar7 >> 0x20);
        result_2.m_backend.data._M_elems[2] = (uint)uVar11;
        result_2.m_backend.data._M_elems[3] = (uint)((ulong)uVar11 >> 0x20);
        result_2.m_backend.exp = iVar25;
        result_2.m_backend.neg = bVar23;
        result_2.m_backend._48_8_ = uVar6;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&result_2.m_backend,&lowstab.m_backend);
        result_3.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
        result_3.m_backend.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
        result_3.m_backend.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
        result_3.m_backend.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
        result_3.m_backend.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
        result_3.m_backend.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
        result_3.m_backend.data._M_elems[6] = result_1.m_backend.data._M_elems[6];
        result_3.m_backend.data._M_elems[7] = result_1.m_backend.data._M_elems[7];
        result_3.m_backend.data._M_elems[8] = result_1.m_backend.data._M_elems[8];
        result_3.m_backend.data._M_elems[9] = result_1.m_backend.data._M_elems[9];
        result_3.m_backend.exp = result_1.m_backend.exp;
        result_3.m_backend.neg = result_1.m_backend.neg;
        result_3.m_backend.fpclass = result_1.m_backend.fpclass;
        result_3.m_backend.prec_elem = result_1.m_backend.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&result_3.m_backend,&result_2.m_backend);
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_3f8,&result_3.m_backend);
        if (((lowstab.m_backend.fpclass != cpp_dec_float_NaN) &&
            (local_4d8.fpclass != cpp_dec_float_NaN)) &&
           (iVar24 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&lowstab.m_backend,&local_4d8), 0 < iVar24)) {
          local_4d8.data._M_elems[8] = lowstab.m_backend.data._M_elems[8];
          local_4d8.data._M_elems[9] =
               (uint)(CONCAT35(lowstab.m_backend.data._M_elems[9]._1_3_,
                               lowstab.m_backend.data._M_elems._32_5_) >> 0x20);
          local_4d8.data._M_elems[4] = lowstab.m_backend.data._M_elems[4];
          local_4d8.data._M_elems[5] = lowstab.m_backend.data._M_elems[5];
          local_4d8.data._M_elems[6] = lowstab.m_backend.data._M_elems[6];
          local_4d8.data._M_elems[7] =
               (uint)(CONCAT35(lowstab.m_backend.data._M_elems[7]._1_3_,
                               lowstab.m_backend.data._M_elems._24_5_) >> 0x20);
          local_4d8.data._M_elems[0] = lowstab.m_backend.data._M_elems[0];
          local_4d8.data._M_elems[1] = lowstab.m_backend.data._M_elems[1];
          local_4d8.data._M_elems[2] = lowstab.m_backend.data._M_elems[2];
          local_4d8.data._M_elems[3] = lowstab.m_backend.data._M_elems[3];
          local_4d8.exp = lowstab.m_backend.exp;
          local_4d8.neg = lowstab.m_backend.neg;
          local_4d8.fpclass = lowstab.m_backend.fpclass;
          local_4d8.prec_elem = lowstab.m_backend.prec_elem;
        }
        uVar32 = uVar32 + 1;
        this = local_410;
        fVar26 = local_3f8.fpclass;
        if ((nBp <= (int)uVar32) ||
           (lVar28 = lVar28 + 0x40, local_5d4 = uVar32, local_3f8.fpclass == cpp_dec_float_NaN))
        goto LAB_002dec91;
      }
      fVar26 = local_3f8.fpclass;
    }
  }
LAB_002dec91:
  uVar29 = uVar32 - 1;
  local_490 = &(this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .delta;
  local_5d4 = uVar29;
  if ((fVar26 != cpp_dec_float_NaN) &&
     (((this->
       super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).
       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       .delta.m_backend.fpclass != cpp_dec_float_NaN &&
      (iVar24 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_3f8,&local_490->m_backend), nBp <= (int)uVar32 && 0 < iVar24)))) {
    lowstab.m_backend.data._M_elems[0] = 0;
    lowstab.m_backend.data._M_elems[1] = 0x3fe00000;
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
    ::operator-=((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                  *)this_00,(double *)&lowstab);
    *(undefined8 *)((val->m_backend).data._M_elems + 8) = local_518.data._M_elems._32_8_;
    *(undefined8 *)((val->m_backend).data._M_elems + 4) = local_518.data._M_elems._16_8_;
    *(undefined8 *)((val->m_backend).data._M_elems + 6) = local_518.data._M_elems._24_8_;
    *(undefined8 *)(val->m_backend).data._M_elems = local_518.data._M_elems._0_8_;
    *(undefined8 *)((val->m_backend).data._M_elems + 2) = local_518.data._M_elems._8_8_;
    (val->m_backend).exp = local_518.exp;
    (val->m_backend).neg = local_518.neg;
    (val->m_backend).fpclass = local_518.fpclass;
    (val->m_backend).prec_elem = local_518.prec_elem;
    local_a8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((local_498->m_backend).data._M_elems + 8);
    pnVar30 = &local_a8;
    local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_498->m_backend).data._M_elems;
    local_a8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((local_498->m_backend).data._M_elems + 2);
    local_a8.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((local_498->m_backend).data._M_elems + 4);
    local_a8.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((local_498->m_backend).data._M_elems + 6);
    local_a8.m_backend.exp = (local_498->m_backend).exp;
    local_a8.m_backend.neg = (local_498->m_backend).neg;
    local_a8.m_backend.fpclass = (local_498->m_backend).fpclass;
    local_a8.m_backend.prec_elem = (local_498->m_backend).prec_elem;
    polish = false;
LAB_002de468:
    iVar24 = SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::selectLeave(&this->
                            super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ,val,pnVar30,polish);
    return iVar24;
  }
  lVar28 = (long)(int)uVar29;
  pBVar4 = (this->breakpoints).data.
           super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  result_3.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)((long)&pBVar4[lVar28].val.m_backend + 0x20);
  result_3.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pBVar4[lVar28].val.m_backend;
  result_3.m_backend.data._M_elems._8_8_ = *(undefined8 *)((long)&pBVar4[lVar28].val.m_backend + 8);
  puVar1 = (uint *)((long)&pBVar4[lVar28].val.m_backend + 0x10);
  result_3.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  result_3.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
  result_3.m_backend.exp = *(int *)((long)&pBVar4[lVar28].val.m_backend + 0x28);
  result_3.m_backend.neg = *(bool *)((long)&pBVar4[lVar28].val.m_backend + 0x2c);
  result_3.m_backend._48_8_ = *(undefined8 *)((long)&pBVar4[lVar28].val.m_backend + 0x30);
  local_5cc = 0xffffffff;
  if ((int)uVar32 < nBp) {
    lVar28 = lVar28 + 1;
    uVar33 = lVar28 * 0x40 | 0x38;
    local_5cc = 0xffffffff;
    do {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&result_1.m_backend,0,(type *)0x0);
      if (local_5d8 <= (int)((uint)lVar28 - 1)) {
        local_5d8 = SPxQuicksortPart<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::Breakpoint,soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::BreakpointCompare>
                              ((this->breakpoints).data.
                               super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                               ._M_impl.super__Vector_impl_data._M_start,&local_400,local_5d8 + 1,
                               nBp,4,0,0,true);
      }
      iVar24 = *(int *)((long)&(((this->breakpoints).data.
                                 super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->val).m_backend + uVar33
                       );
      uVar5 = *(undefined8 *)(upd[iVar24].m_backend.data._M_elems + 8);
      result_2.m_backend.data._M_elems[8] = (uint)uVar5;
      result_2.m_backend.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
      pnVar31 = upd + iVar24;
      uVar6 = *(undefined8 *)(pnVar31->m_backend).data._M_elems;
      uVar7 = *(undefined8 *)((pnVar31->m_backend).data._M_elems + 2);
      lowstab.m_backend.data._M_elems._0_16_ =
           *(undefined1 (*) [16])(pnVar31->m_backend).data._M_elems;
      puVar1 = upd[iVar24].m_backend.data._M_elems + 4;
      lowstab.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar11 = *(undefined8 *)(puVar1 + 2);
      result_2.m_backend.data._M_elems[4] = lowstab.m_backend.data._M_elems[4];
      result_2.m_backend.data._M_elems[5] = lowstab.m_backend.data._M_elems[5];
      result_2.m_backend.data._M_elems[6] = (uint)uVar11;
      result_2.m_backend.data._M_elems[7] = (uint)((ulong)uVar11 >> 0x20);
      result_2.m_backend.data._M_elems[0] = (uint)uVar6;
      result_2.m_backend.data._M_elems[1] = (uint)((ulong)uVar6 >> 0x20);
      result_2.m_backend.data._M_elems[2] = (uint)uVar7;
      result_2.m_backend.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
      lowstab.m_backend.exp = upd[iVar24].m_backend.exp;
      result_2.m_backend.neg = upd[iVar24].m_backend.neg;
      result_2.m_backend.fpclass = upd[iVar24].m_backend.fpclass;
      result_2.m_backend.prec_elem = upd[iVar24].m_backend.prec_elem;
      lowstab.m_backend.data._M_elems._32_5_ = SUB85(uVar5,0);
      lowstab.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
      lowstab.m_backend.data._M_elems._24_5_ = SUB85(uVar11,0);
      lowstab.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar11 >> 0x28);
      lowstab.m_backend.prec_elem = result_2.m_backend.prec_elem;
      lowstab.m_backend.fpclass = result_2.m_backend.fpclass;
      lowstab.m_backend.neg = result_2.m_backend.neg;
      if ((result_2.m_backend.neg == true) &&
         (result_2.m_backend.data._M_elems[0] != 0 ||
          result_2.m_backend.fpclass != cpp_dec_float_finite)) {
        lowstab.m_backend.neg = false;
      }
      result_2.m_backend.exp = lowstab.m_backend.exp;
      if (((result_2.m_backend.fpclass == cpp_dec_float_NaN) ||
          (local_4d8.fpclass == cpp_dec_float_NaN)) ||
         (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&lowstab.m_backend,&local_4d8), iVar25 < 1)) {
        lowstab.m_backend.fpclass = cpp_dec_float_finite;
        lowstab.m_backend.prec_elem = 10;
        lowstab.m_backend.data._M_elems[0] = 0;
        lowstab.m_backend.data._M_elems[1] = 0;
        lowstab.m_backend.data._M_elems[2] = 0;
        lowstab.m_backend.data._M_elems[3] = 0;
        lowstab.m_backend.data._M_elems[4] = 0;
        lowstab.m_backend.data._M_elems[5] = 0;
        lowstab.m_backend.data._M_elems._24_5_ = 0;
        lowstab.m_backend.data._M_elems[7]._1_3_ = 0;
        lowstab.m_backend.data._M_elems._32_5_ = 0;
        lowstab.m_backend.data._M_elems[9]._1_3_ = 0;
        lowstab.m_backend.exp = 0;
        lowstab.m_backend.neg = false;
        if (&lowstab != local_490) {
          uVar5 = *(undefined8 *)((local_490->m_backend).data._M_elems + 8);
          lowstab.m_backend.data._M_elems._32_5_ = SUB85(uVar5,0);
          lowstab.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
          lowstab.m_backend.data._M_elems._0_16_ =
               *(undefined1 (*) [16])(local_490->m_backend).data._M_elems;
          lowstab.m_backend.data._M_elems._16_8_ =
               *(undefined8 *)((local_490->m_backend).data._M_elems + 4);
          uVar5 = *(undefined8 *)((local_490->m_backend).data._M_elems + 6);
          lowstab.m_backend.data._M_elems._24_5_ = SUB85(uVar5,0);
          lowstab.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
          lowstab.m_backend.exp =
               (this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .delta.m_backend.exp;
          lowstab.m_backend.neg =
               (this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .delta.m_backend.neg;
          lowstab.m_backend.fpclass =
               (this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .delta.m_backend.fpclass;
          lowstab.m_backend.prec_elem =
               (this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .delta.m_backend.prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                  (&lowstab.m_backend,&result_3.m_backend);
        if (((result_1.m_backend.fpclass != cpp_dec_float_NaN) &&
            (lowstab.m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar24 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&result_1.m_backend,&lowstab.m_backend), 0 < iVar24)) break;
      }
      else {
        pnVar31 = low;
        if (result_2.m_backend.fpclass != cpp_dec_float_NaN) {
          lowstab.m_backend.fpclass = cpp_dec_float_finite;
          lowstab.m_backend.prec_elem = 10;
          lowstab.m_backend.data._M_elems[0] = 0;
          lowstab.m_backend.data._M_elems[1] = 0;
          lowstab.m_backend.data._M_elems[2] = 0;
          lowstab.m_backend.data._M_elems[3] = 0;
          lowstab.m_backend.data._M_elems[4] = 0;
          lowstab.m_backend.data._M_elems[5] = 0;
          lowstab.m_backend.data._M_elems._24_5_ = 0;
          lowstab.m_backend.data._M_elems[7]._1_3_ = 0;
          lowstab.m_backend.data._M_elems._32_5_ = 0;
          lowstab.m_backend.data._M_elems[9]._1_3_ = 0;
          lowstab.m_backend.exp = 0;
          lowstab.m_backend.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&lowstab.m_backend,0.0);
          iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&result_2.m_backend,&lowstab.m_backend);
          if (0 < iVar25) {
            pnVar31 = upp;
          }
        }
        result_1.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(pnVar31[iVar24].m_backend.data._M_elems + 8);
        result_1.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)pnVar31[iVar24].m_backend.data._M_elems;
        result_1.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(pnVar31[iVar24].m_backend.data._M_elems + 2);
        puVar1 = pnVar31[iVar24].m_backend.data._M_elems + 4;
        result_1.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        result_1.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        result_1.m_backend.exp = pnVar31[iVar24].m_backend.exp;
        result_1.m_backend.neg = pnVar31[iVar24].m_backend.neg;
        result_1.m_backend.fpclass = pnVar31[iVar24].m_backend.fpclass;
        result_1.m_backend.prec_elem = pnVar31[iVar24].m_backend.prec_elem;
        local_448.fpclass = cpp_dec_float_finite;
        local_448.prec_elem = 10;
        local_448.data._M_elems[0] = 0;
        local_448.data._M_elems[1] = 0;
        local_448.data._M_elems[2] = 0;
        local_448.data._M_elems[3] = 0;
        local_448.data._M_elems[4] = 0;
        local_448.data._M_elems[5] = 0;
        local_448.data._M_elems._24_5_ = 0;
        local_448.data._M_elems[7]._1_3_ = 0;
        local_448.data._M_elems._32_5_ = 0;
        local_448.data._M_elems[9]._1_3_ = 0;
        local_448.exp = 0;
        local_448.neg = false;
        if (&local_448 == &pnVar30[iVar24].m_backend) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_448,&result_1.m_backend);
          if (local_448.data._M_elems[0] != 0 || local_448.fpclass != cpp_dec_float_finite) {
            local_448.neg = (bool)(local_448.neg ^ 1);
          }
        }
        else {
          local_448.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
          local_448.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
          local_448.data._M_elems._24_5_ = result_1.m_backend.data._M_elems._24_5_;
          local_448.data._M_elems[7]._1_3_ = result_1.m_backend.data._M_elems[7]._1_3_;
          local_448.prec_elem = result_1.m_backend.prec_elem;
          local_448.fpclass = result_1.m_backend.fpclass;
          local_448.data._M_elems._0_8_ = result_1.m_backend.data._M_elems._0_8_;
          local_448.data._M_elems._8_8_ = result_1.m_backend.data._M_elems._8_8_;
          local_448.data._M_elems._16_8_ = result_1.m_backend.data._M_elems._16_8_;
          local_448.exp = result_1.m_backend.exp;
          local_448.neg = result_1.m_backend.neg;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_448,&pnVar30[iVar24].m_backend);
        }
        lowstab.m_backend.fpclass = cpp_dec_float_finite;
        lowstab.m_backend.prec_elem = 10;
        lowstab.m_backend.data._M_elems._0_16_ = ZEXT816(0);
        lowstab.m_backend.data._M_elems[4] = 0;
        lowstab.m_backend.data._M_elems[5] = 0;
        lowstab.m_backend.data._M_elems._24_5_ = 0;
        lowstab.m_backend.data._M_elems[7]._1_3_ = 0;
        lowstab.m_backend.data._M_elems._32_5_ = 0;
        lowstab.m_backend.data._M_elems[9]._1_3_ = 0;
        lowstab.m_backend.exp = 0;
        lowstab.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&lowstab.m_backend,&local_448,&result_2.m_backend);
        auVar16 = (undefined1  [16])lowstab.m_backend.data._M_elems._0_16_;
        result_1.m_backend.data._M_elems[9]._1_3_ = lowstab.m_backend.data._M_elems[9]._1_3_;
        result_1.m_backend.data._M_elems._32_5_ = lowstab.m_backend.data._M_elems._32_5_;
        result_1.m_backend.data._M_elems[7]._1_3_ = lowstab.m_backend.data._M_elems[7]._1_3_;
        result_1.m_backend.data._M_elems._24_5_ = lowstab.m_backend.data._M_elems._24_5_;
        result_1.m_backend.data._M_elems[4] = lowstab.m_backend.data._M_elems[4];
        result_1.m_backend.data._M_elems[5] = lowstab.m_backend.data._M_elems[5];
        result_1.m_backend.data._M_elems[0] = lowstab.m_backend.data._M_elems[0];
        result_1.m_backend.data._M_elems[1] = lowstab.m_backend.data._M_elems[1];
        result_1.m_backend.data._M_elems[2] = lowstab.m_backend.data._M_elems[2];
        result_1.m_backend.data._M_elems[3] = lowstab.m_backend.data._M_elems[3];
        result_1.m_backend.exp = lowstab.m_backend.exp;
        result_1.m_backend.neg = lowstab.m_backend.neg;
        result_1.m_backend.fpclass = lowstab.m_backend.fpclass;
        result_1.m_backend.prec_elem = lowstab.m_backend.prec_elem;
        lowstab.m_backend.data._M_elems._0_16_ = auVar16;
        if (((lowstab.m_backend.fpclass != cpp_dec_float_NaN) &&
            (result_3.m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar24 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&result_1.m_backend,&result_3.m_backend), iVar24 < 1)) {
          local_4d8.neg = result_2.m_backend.neg;
          if (result_2.m_backend.neg == true) {
            local_4d8.neg =
                 result_2.m_backend.fpclass == cpp_dec_float_finite &&
                 result_2.m_backend.data._M_elems[0] == 0;
          }
          local_4d8.data._M_elems[0] = result_2.m_backend.data._M_elems[0];
          local_4d8.data._M_elems[9] = result_2.m_backend.data._M_elems[9];
          local_4d8.data._M_elems[5] = result_2.m_backend.data._M_elems[5];
          local_4d8.data._M_elems[6] = result_2.m_backend.data._M_elems[6];
          local_4d8.data._M_elems[7] = result_2.m_backend.data._M_elems[7];
          local_4d8.data._M_elems[8] = result_2.m_backend.data._M_elems[8];
          local_4d8.data._M_elems[1] = result_2.m_backend.data._M_elems[1];
          local_4d8.data._M_elems[2] = result_2.m_backend.data._M_elems[2];
          local_4d8.data._M_elems[3] = result_2.m_backend.data._M_elems[3];
          local_4d8.data._M_elems[4] = result_2.m_backend.data._M_elems[4];
          local_4d8.exp = result_2.m_backend.exp;
          local_4d8.fpclass = result_2.m_backend.fpclass;
          local_4d8.prec_elem = result_2.m_backend.prec_elem;
          local_5cc = (uint)lVar28;
        }
      }
      lVar28 = lVar28 + 1;
      uVar33 = uVar33 + 0x40;
    } while (lVar28 < nBp);
  }
  pnVar31 = &(this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).fastDelta;
  lowstab.m_backend.fpclass = cpp_dec_float_finite;
  lowstab.m_backend.prec_elem = 10;
  lowstab.m_backend.data._M_elems[0] = 0;
  lowstab.m_backend.data._M_elems[1] = 0;
  lowstab.m_backend.data._M_elems[2] = 0;
  lowstab.m_backend.data._M_elems[3] = 0;
  lowstab.m_backend.data._M_elems[4] = 0;
  lowstab.m_backend.data._M_elems[5] = 0;
  lowstab.m_backend.data._M_elems._24_5_ = 0;
  lowstab.m_backend.data._M_elems[7]._1_3_ = 0;
  lowstab.m_backend.data._M_elems._32_5_ = 0;
  lowstab.m_backend.data._M_elems[9]._1_3_ = 0;
  lowstab.m_backend.exp = 0;
  lowstab.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&lowstab.m_backend,&pnVar31->m_backend,&local_4d8);
  local_3b8[9]._1_3_ = lowstab.m_backend.data._M_elems[9]._1_3_;
  local_3b8._32_5_ = lowstab.m_backend.data._M_elems._32_5_;
  local_3b8[7]._1_3_ = lowstab.m_backend.data._M_elems[7]._1_3_;
  local_3b8._24_5_ = lowstab.m_backend.data._M_elems._24_5_;
  local_3b8[4] = lowstab.m_backend.data._M_elems[4];
  local_3b8[5] = lowstab.m_backend.data._M_elems[5];
  local_3b8[0] = lowstab.m_backend.data._M_elems[0];
  local_3b8[1] = lowstab.m_backend.data._M_elems[1];
  local_3b8[2] = lowstab.m_backend.data._M_elems[2];
  local_3b8[3] = lowstab.m_backend.data._M_elems[3];
  local_5d8 = lowstab.m_backend.exp;
  local_490 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)CONCAT71(local_490._1_7_,lowstab.m_backend.neg);
  fVar26 = lowstab.m_backend.fpclass;
  iVar21 = lowstab.m_backend.prec_elem;
  bVar23 = ((this->
            super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .thesolver)->instableEnter;
  peVar10 = (this->
            super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->
            super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  dVar2 = peVar10->s_epsilon_multiplier;
  uVar33 = -(ulong)(dVar2 == 1.0);
  lowstab.m_backend.fpclass = cpp_dec_float_finite;
  lowstab.m_backend.prec_elem = 10;
  lowstab.m_backend.data._M_elems._0_16_ = ZEXT816(0);
  lowstab.m_backend.data._M_elems[4] = 0;
  lowstab.m_backend.data._M_elems[5] = 0;
  lowstab.m_backend.data._M_elems._24_5_ = 0;
  lowstab.m_backend.data._M_elems[7]._1_3_ = 0;
  lowstab.m_backend.data._M_elems._32_5_ = 0;
  lowstab.m_backend.data._M_elems[9]._1_3_ = 0;
  lowstab.m_backend.exp = 0;
  lowstab.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&lowstab,
             (double)(~uVar33 & (ulong)(dVar2 * 1e-10) | uVar33 & 0x3ddb7cdfd9d7bdbb));
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  auVar16 = (undefined1  [16])lowstab.m_backend.data._M_elems._0_16_;
  if (bVar23 == false) {
    local_e8.m_backend.data._M_elems[9] = local_4d8.data._M_elems[9];
    local_e8.m_backend.data._M_elems[8] = local_4d8.data._M_elems[8];
    local_e8.m_backend.data._M_elems[1] = local_4d8.data._M_elems[1];
    local_e8.m_backend.data._M_elems[0] = local_4d8.data._M_elems[0];
    local_e8.m_backend.data._M_elems[3] = local_4d8.data._M_elems[3];
    local_e8.m_backend.data._M_elems[2] = local_4d8.data._M_elems[2];
    local_e8.m_backend.data._M_elems[5] = local_4d8.data._M_elems[5];
    local_e8.m_backend.data._M_elems[4] = local_4d8.data._M_elems[4];
    local_e8.m_backend.data._M_elems[7] = local_4d8.data._M_elems[7];
    local_e8.m_backend.data._M_elems[6] = local_4d8.data._M_elems[6];
    local_e8.m_backend.exp = local_4d8.exp;
    local_e8.m_backend.neg = local_4d8.neg;
    local_e8.m_backend.fpclass = local_4d8.fpclass;
    local_e8.m_backend.prec_elem = local_4d8.prec_elem;
    SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::minStability(&result_1,
                   &this->
                    super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ,&local_e8);
    pnVar17 = &result_1;
    stab.m_backend.exp = result_1.m_backend.exp;
    stab.m_backend.neg = result_1.m_backend.neg;
    stab.m_backend.fpclass = result_1.m_backend.fpclass;
  }
  else {
    pnVar17 = &lowstab;
    uVar7._5_3_ = lowstab.m_backend.data._M_elems[9]._1_3_;
    uVar7._0_5_ = lowstab.m_backend.data._M_elems._32_5_;
    result_1.m_backend.data._M_elems[8] = lowstab.m_backend.data._M_elems[8];
    result_1.m_backend.data._M_elems[9] = SUB84(uVar7,4);
    uVar5._5_3_ = lowstab.m_backend.data._M_elems[7]._1_3_;
    uVar5._0_5_ = lowstab.m_backend.data._M_elems._24_5_;
    result_1.m_backend.data._M_elems[4] = lowstab.m_backend.data._M_elems[4];
    result_1.m_backend.data._M_elems[5] = lowstab.m_backend.data._M_elems[5];
    result_1.m_backend.data._M_elems[6] = lowstab.m_backend.data._M_elems[6];
    result_1.m_backend.data._M_elems[7] = SUB84(uVar5,4);
    result_1.m_backend.data._M_elems[0] = lowstab.m_backend.data._M_elems[0];
    result_1.m_backend.data._M_elems[1] = lowstab.m_backend.data._M_elems[1];
    result_1.m_backend.data._M_elems[2] = lowstab.m_backend.data._M_elems[2];
    result_1.m_backend.data._M_elems[3] = lowstab.m_backend.data._M_elems[3];
    stab.m_backend.exp = lowstab.m_backend.exp;
    stab.m_backend.neg = lowstab.m_backend.neg;
    stab.m_backend.fpclass = lowstab.m_backend.fpclass;
    lowstab.m_backend.data._M_elems._0_16_ = auVar16;
  }
  uVar32 = local_5cc;
  stab.m_backend.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
  stab.m_backend.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
  stab.m_backend.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
  stab.m_backend.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
  stab.m_backend.data._M_elems._24_5_ = result_1.m_backend.data._M_elems._24_5_;
  stab.m_backend.data._M_elems[7]._1_3_ = result_1.m_backend.data._M_elems[7]._1_3_;
  stab.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
  stab.m_backend.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
  stab.m_backend.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
  stab.m_backend.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
  stab.m_backend.prec_elem = (pnVar17->m_backend).prec_elem;
  if ((int)local_5cc < 0) {
    if (-1 < (int)local_5d4) {
      uVar32 = local_5d4;
      do {
        while (uVar29 = uVar32,
              iVar24 = (this->breakpoints).data.
                       super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar29].idx, -1 < iVar24) {
          local_228.m_backend.data._M_elems[9] = local_4d8.data._M_elems[9];
          local_228.m_backend.data._M_elems[8] = local_4d8.data._M_elems[8];
          local_228.m_backend.data._M_elems[1] = local_4d8.data._M_elems[1];
          local_228.m_backend.data._M_elems[0] = local_4d8.data._M_elems[0];
          local_228.m_backend.data._M_elems[3] = local_4d8.data._M_elems[3];
          local_228.m_backend.data._M_elems[2] = local_4d8.data._M_elems[2];
          local_228.m_backend.data._M_elems[5] = local_4d8.data._M_elems[5];
          local_228.m_backend.data._M_elems[4] = local_4d8.data._M_elems[4];
          local_228.m_backend.data._M_elems[7] = local_4d8.data._M_elems[7];
          local_228.m_backend.data._M_elems[6] = local_4d8.data._M_elems[6];
          local_228.m_backend.exp = local_4d8.exp;
          local_228.m_backend.neg = local_4d8.neg;
          local_228.m_backend.fpclass = local_4d8.fpclass;
          local_228.m_backend.prec_elem = local_4d8.prec_elem;
          local_2a8.m_backend.data._M_elems[0] = local_3b8[0];
          local_2a8.m_backend.data._M_elems[1] = local_3b8[1];
          local_2a8.m_backend.data._M_elems[2] = local_3b8[2];
          local_2a8.m_backend.data._M_elems[3] = local_3b8[3];
          local_2a8.m_backend.data._M_elems[4] = local_3b8[4];
          local_2a8.m_backend.data._M_elems[5] = local_3b8[5];
          local_2a8.m_backend.data._M_elems[6] = local_3b8[6];
          local_2a8.m_backend.data._M_elems[7] = local_3b8[7];
          local_2a8.m_backend.data._M_elems[8] = local_3b8[8];
          local_2a8.m_backend.data._M_elems[9] = local_3b8[9];
          local_2a8.m_backend.exp = local_5d8;
          local_2a8.m_backend.neg = (bool)local_490._0_1_;
          local_2a8.m_backend.fpclass = fVar26;
          local_2a8.m_backend.prec_elem = iVar21;
          local_268.m_backend.data._M_elems[0] = local_518.data._M_elems[0];
          local_268.m_backend.data._M_elems[1] = local_518.data._M_elems[1];
          local_268.m_backend.data._M_elems[2] = local_518.data._M_elems[2];
          local_268.m_backend.data._M_elems[3] = local_518.data._M_elems[3];
          local_268.m_backend.data._M_elems[4] = local_518.data._M_elems[4];
          local_268.m_backend.data._M_elems[5] = local_518.data._M_elems[5];
          local_268.m_backend.data._M_elems[6] = local_518.data._M_elems[6];
          local_268.m_backend.data._M_elems[7] = local_518.data._M_elems[7];
          local_268.m_backend.data._M_elems[8] = local_518.data._M_elems[8];
          local_268.m_backend.data._M_elems[9] = local_518.data._M_elems[9];
          local_268.m_backend.exp = local_518.exp;
          local_268.m_backend.neg = local_518.neg;
          local_268.m_backend.fpclass = local_518.fpclass;
          local_268.m_backend.prec_elem = local_518.prec_elem;
          bVar23 = getData(this,val,&leaveIdx,iVar24,&local_228,&local_2a8,upd,pnVar30,low,upp,FVEC,
                           &local_268);
          local_5d4 = uVar29 - 1;
          if ((bVar23) || (uVar32 = local_5d4, uVar29 == 0)) {
            local_5d4 = uVar29;
            if (bVar23) goto LAB_002df823;
            goto LAB_002df926;
          }
        }
        uVar32 = uVar29 - 1;
      } while (uVar29 != 0);
    }
LAB_002df926:
    if (this->relax_count < 2) {
      SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::relax(&this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             );
      this->relax_count = this->relax_count + 1;
      *(undefined8 *)((val->m_backend).data._M_elems + 8) = local_518.data._M_elems._32_8_;
      *(undefined8 *)((val->m_backend).data._M_elems + 4) = local_518.data._M_elems._16_8_;
      *(undefined8 *)((val->m_backend).data._M_elems + 6) = local_518.data._M_elems._24_8_;
      *(undefined8 *)(val->m_backend).data._M_elems = local_518.data._M_elems._0_8_;
      *(undefined8 *)((val->m_backend).data._M_elems + 2) = local_518.data._M_elems._8_8_;
      (val->m_backend).exp = local_518.exp;
      (val->m_backend).neg = local_518.neg;
      (val->m_backend).fpclass = local_518.fpclass;
      (val->m_backend).prec_elem = local_518.prec_elem;
      local_1e8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((local_498->m_backend).data._M_elems + 8);
      local_1e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_498->m_backend).data._M_elems;
      local_1e8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((local_498->m_backend).data._M_elems + 2);
      local_1e8.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((local_498->m_backend).data._M_elems + 4);
      local_1e8.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((local_498->m_backend).data._M_elems + 6);
      local_1e8.m_backend.exp = (local_498->m_backend).exp;
      local_1e8.m_backend.neg = (local_498->m_backend).neg;
      local_1e8.m_backend.fpclass = (local_498->m_backend).fpclass;
      local_1e8.m_backend.prec_elem = (local_498->m_backend).prec_elem;
      leaveIdx = selectLeave(this,val,&local_1e8,false);
    }
    return leaveIdx;
  }
  if ((stab.m_backend.fpclass == cpp_dec_float_NaN || local_4d8.fpclass == cpp_dec_float_NaN) ||
     (iVar24 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&local_4d8,&stab.m_backend), iVar24 < 1)) goto LAB_002df926;
  local_128.m_backend.data._M_elems[9] = local_4d8.data._M_elems[9];
  local_128.m_backend.data._M_elems[8] = local_4d8.data._M_elems[8];
  local_128.m_backend.data._M_elems[1] = local_4d8.data._M_elems[1];
  local_128.m_backend.data._M_elems[0] = local_4d8.data._M_elems[0];
  local_128.m_backend.data._M_elems[3] = local_4d8.data._M_elems[3];
  local_128.m_backend.data._M_elems[2] = local_4d8.data._M_elems[2];
  local_128.m_backend.data._M_elems[5] = local_4d8.data._M_elems[5];
  local_128.m_backend.data._M_elems[4] = local_4d8.data._M_elems[4];
  local_128.m_backend.data._M_elems[7] = local_4d8.data._M_elems[7];
  local_128.m_backend.data._M_elems[6] = local_4d8.data._M_elems[6];
  local_128.m_backend.exp = local_4d8.exp;
  local_128.m_backend.neg = local_4d8.neg;
  local_128.m_backend.fpclass = local_4d8.fpclass;
  local_128.m_backend.prec_elem = local_4d8.prec_elem;
  local_168.m_backend.data._M_elems[0] = local_3b8[0];
  local_168.m_backend.data._M_elems[1] = local_3b8[1];
  local_168.m_backend.data._M_elems[2] = local_3b8[2];
  local_168.m_backend.data._M_elems[3] = local_3b8[3];
  local_168.m_backend.data._M_elems[4] = local_3b8[4];
  local_168.m_backend.data._M_elems[5] = local_3b8[5];
  local_168.m_backend.data._M_elems[6] = local_3b8[6];
  local_168.m_backend.data._M_elems[7] = local_3b8[7];
  local_168.m_backend.data._M_elems[8] = local_3b8[8];
  local_168.m_backend.data._M_elems[9] = local_3b8[9];
  local_168.m_backend.exp = local_5d8;
  local_168.m_backend.neg = (bool)local_490._0_1_;
  local_168.m_backend.fpclass = fVar26;
  local_168.m_backend.prec_elem = iVar21;
  local_1a8.m_backend.data._M_elems[0] = local_518.data._M_elems[0];
  local_1a8.m_backend.data._M_elems[1] = local_518.data._M_elems[1];
  local_1a8.m_backend.data._M_elems[2] = local_518.data._M_elems[2];
  local_1a8.m_backend.data._M_elems[3] = local_518.data._M_elems[3];
  local_1a8.m_backend.data._M_elems[4] = local_518.data._M_elems[4];
  local_1a8.m_backend.data._M_elems[5] = local_518.data._M_elems[5];
  local_1a8.m_backend.data._M_elems[6] = local_518.data._M_elems[6];
  local_1a8.m_backend.data._M_elems[7] = local_518.data._M_elems[7];
  local_1a8.m_backend.data._M_elems[8] = local_518.data._M_elems[8];
  local_1a8.m_backend.data._M_elems[9] = local_518.data._M_elems[9];
  local_1a8.m_backend.exp = local_518.exp;
  local_1a8.m_backend.neg = local_518.neg;
  local_1a8.m_backend.fpclass = local_518.fpclass;
  local_1a8.m_backend.prec_elem = local_518.prec_elem;
  bVar23 = getData(this,val,&leaveIdx,
                   (this->breakpoints).data.
                   super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar32].idx,&local_128,&local_168,upd,
                   pnVar30,low,upp,FVEC,&local_1a8);
  if (!bVar23) goto LAB_002df926;
LAB_002df823:
  uVar32 = local_5d4;
  this->relax_count = 0;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::tighten(&this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           );
  if (0 < (int)uVar32) {
    uVar33 = (ulong)uVar32;
    pBVar4 = (this->breakpoints).data.
             super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
             ._M_impl.super__Vector_impl_data._M_start;
    result_1.m_backend.exp = *(int *)((long)&pBVar4[uVar33].val.m_backend + 0x28);
    result_1.m_backend.neg = *(bool *)((long)&pBVar4[uVar33].val.m_backend + 0x2c);
    result_1.m_backend._48_8_ = *(undefined8 *)((long)&pBVar4[uVar33].val.m_backend + 0x30);
    result_1.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pBVar4[uVar33].val.m_backend;
    result_1.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((long)&pBVar4[uVar33].val.m_backend + 8);
    puVar1 = (uint *)((long)&pBVar4[uVar33].val.m_backend + 0x10);
    result_1.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    result_1.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    result_1.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((long)&pBVar4[uVar33].val.m_backend + 0x20);
    if ((result_1.m_backend.neg == true) &&
       (result_1.m_backend.data._M_elems[0] != 0 ||
        result_1.m_backend.fpclass != cpp_dec_float_finite)) {
      result_1.m_backend.neg = false;
    }
    if (((result_1.m_backend.fpclass != cpp_dec_float_NaN) &&
        ((this->
         super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).fastDelta.m_backend.fpclass != cpp_dec_float_NaN)) &&
       (iVar24 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&result_1.m_backend,&pnVar31->m_backend), 0 < iVar24)) {
      flipAndUpdate(this,(int *)&local_5d4);
      ((this->
       super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).
       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .thesolver)->boundflips = local_5d4;
      if (9 < (int)local_5d4) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)this_00,1);
        return leaveIdx;
      }
      result_1.m_backend.data._M_elems[0] = 0x9999999a;
      result_1.m_backend.data._M_elems[1] = 0x3fa99999;
      goto LAB_002dfa04;
    }
  }
  ((this->
   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
   ).
   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .thesolver)->boundflips = 0;
  result_1.m_backend.data._M_elems[0] = 0x9999999a;
  result_1.m_backend.data._M_elems[1] = 0x3fb99999;
LAB_002dfa04:
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
  ::operator-=((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                *)this_00,(double *)&result_1);
  return leaveIdx;
}

Assistant:

int SPxBoundFlippingRT<R>::selectLeave(
   R&                 val,
   R                  enterTest,
   bool                  polish
)
{
   assert(this->m_type == SPxSolverBase<R>::ENTER);
   assert(this->thesolver->boundflips == 0);

   // reset the history and try again to do some long steps
   if(this->thesolver->enterCount % SOPLEX_LONGSTEP_FREQ == 0)
   {
      SPxOut::debug(this, "DEBFRT06 resetting long step history\n");
      flipPotential = 1;
   }

   if(polish || !enableBoundFlips || !enableRowBoundFlips
         || this->thesolver->rep() == SPxSolverBase<R>::COLUMN || flipPotential <= 0)
   {
      SPxOut::debug(this, "DEBFRT07 switching to fast ratio test\n");
      return SPxFastRT<R>::selectLeave(val, enterTest, polish);
   }

   const R*  vec =
      this->thesolver->fVec().get_const_ptr();         /**< pointer to values of current VectorBase<R> */
   const R*  upd =
      this->thesolver->fVec().delta().values();        /**< pointer to update values of current VectorBase<R> */
   const int*   idx =
      this->thesolver->fVec().delta().indexMem();      /**< pointer to indices of current VectorBase<R> */
   int          updnnz =
      this->thesolver->fVec().delta().size();       /**< number of nonzeros in update VectorBase<R> */
   const R*  lb  =
      this->thesolver->lbBound().get_const_ptr();      /**< pointer to lower bound/lhs of current VectorBase<R> */
   const R*  ub  =
      this->thesolver->ubBound().get_const_ptr();      /**< pointer to upper bound/rhs of current VectorBase<R> */

   R max;

   // index in breakpoint array of minimal value (i.e. choice of normal RT)
   int minIdx;

   // temporary breakpoint data structure to make swaps possible
   Breakpoint tmp;

   // most stable pivot value in candidate set
   R moststable;

   // initialize invalid leaving index
   int leaveIdx = -1;

   // slope of objective function improvement
   R slope;

   // number of found breakpoints
   int nBp;

   // number of passed breakpoints
   int npassedBp;

   R degeneps;
   R stab;
   bool instable;

   max = val;
   val = 0.0;
   moststable = 0.0;
   nBp = 0;
   minIdx = -1;

   assert(this->thesolver->fVec().delta().isSetup());

   // get breakpoints and and determine the index of the minimal value
   if(max > 0)
   {
      collectBreakpointsMax(nBp, minIdx, idx, updnnz, upd, vec, ub, lb, FVEC);
   }
   else
   {
      collectBreakpointsMin(nBp, minIdx, idx, updnnz, upd, vec, ub, lb, FVEC);
   }

   // return -1 if no BP was found
   if(nBp == 0)
   {
      val = max;
      return leaveIdx;
   }

   assert(minIdx >= 0);

   // swap smallest breakpoint to the front to skip the sorting phase if no bound flip is possible
   tmp = breakpoints[minIdx];
   breakpoints[minIdx] = breakpoints[0];
   breakpoints[0] = tmp;

#ifndef NDEBUG

   if(std::is_floating_point<R>::value)
   {
      for(int i = 0; i < breakpoints.size(); ++i)
      {
         // nan values cannot be handled in sorting
         assert(!isnan(breakpoints[i].val));
         // the breakpoint formulas should not produce inf values
         assert(!isinf(breakpoints[i].val));
      }
   }

#endif

   // get initial slope
   slope = spxAbs(enterTest);

   if(slope == 0)
   {
      // this may only happen if SoPlex decides to make an instable pivot
      assert(this->thesolver->instableEnterId.isValid());
      // restore original slope
      slope = this->thesolver->instableEnterVal;
   }

   // set up structures for the quicksort implementation
   BreakpointCompare compare;
   compare.entry = breakpoints.get_const_ptr();

   // pointer to end of sorted part of breakpoints
   int sorted = 0;
   // minimum number of entries that are supposed to be sorted by partial sort
   int sortsize = 4;

   // get all skipable breakpoints
   for(npassedBp = 0; npassedBp < nBp && slope > 0; ++npassedBp)
   {
      // sort breakpoints only partially to save time
      if(npassedBp > sorted)
      {
         sorted = SPxQuicksortPart(breakpoints.get_ptr(), compare, sorted + 1, nBp, sortsize);
      }

      assert(breakpoints[npassedBp].src == FVEC);
      int breakpointidx = breakpoints[npassedBp].idx;
      // compute new slope
      R upper;
      R lower;
      R absupd = spxAbs(upd[breakpointidx]);
      SPxId baseId = this->thesolver->baseId(breakpointidx);
      int i = this->thesolver->number(baseId);

      if(baseId.isSPxColId())
      {
         upper = this->thesolver->upper(i);
         lower = this->thesolver->lower(i);
      }
      else
      {
         assert(baseId.isSPxRowId());
         upper = this->thesolver->rhs(i);
         lower = this->thesolver->lhs(i);
      }

      slope -= (upper * absupd) - (lower * absupd);

      // get most stable pivot
      if(absupd > moststable)
         moststable = absupd;
   }

   --npassedBp;
   assert(npassedBp >= 0);

   // check for unboundedness/infeasibility
   if(slope > this->delta && npassedBp >= nBp - 1)
   {
      SPxOut::debug(this, "DEBFRT02 {}: unboundedness in ratio test\n",
                    this->thesolver->basis().iteration());
      flipPotential -= 0.5;
      val = max;
      return SPxFastRT<R>::selectLeave(val, enterTest);
   }

   SPxOut::debug(this, "DEBFRT01 {}: number of flip candidates: {}\n",
                 this->thesolver->basis().iteration(), npassedBp);

   // try to get a more stable pivot by looking at those with similar step length
   int stableBp;              // index to walk over additional breakpoints (after slope change)
   int bestBp = -1;           // breakpoints index with best possible stability
   R bestDelta = breakpoints[npassedBp].val;  // best step length (after bound flips)

   for(stableBp = npassedBp + 1; stableBp < nBp; ++stableBp)
   {
      R stableDelta = 0;

      // get next breakpoints in increasing order
      if(stableBp > sorted)
      {
         sorted = SPxQuicksortPart(breakpoints.get_ptr(), compare, sorted + 1, nBp, sortsize);
      }

      int breakpointidx = breakpoints[stableBp].idx;
      assert(breakpoints[stableBp].src == FVEC);
      R x = upd[breakpointidx];

      if(spxAbs(x) > moststable)
      {
         stableDelta = (x > 0.0) ? ub[breakpointidx] : lb[breakpointidx];
         stableDelta = (stableDelta - vec[breakpointidx]) / x;

         if(stableDelta <= bestDelta)
         {
            moststable = spxAbs(x);
            bestBp = stableBp;
         }
      }
      // stop searching if the step length is too big
      else if(stableDelta > this->delta + bestDelta)
         break;
   }

   degeneps = this->fastDelta / moststable;  /* as in SPxFastRT */
   // get stability requirements
   instable = this->thesolver->instableEnter;
   assert(!instable || this->thesolver->instableEnterId.isValid());
   R lowstab = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_LOWSTAB);
   stab = instable ? lowstab : SPxFastRT<R>::minStability(moststable);

   bool foundStable = false;

   if(bestBp >= 0)
   {
      // found a more stable pivot
      if(moststable > stab)
      {
         // stability requirements are satisfied
         int breakpointidx = breakpoints[bestBp].idx;
         assert(breakpointidx >= 0);
         foundStable = getData(val, leaveIdx, breakpointidx, moststable, degeneps, upd, vec, lb, ub, FVEC,
                               max);
      }
   }

   else
   {
      // scan passed breakpoints from back to front and stop as soon as a good one is found
      while(!foundStable && npassedBp >= 0)
      {
         int breakpointidx = breakpoints[npassedBp].idx;

         // only look for non-basic variables
         if(breakpointidx >= 0)
         {
            foundStable = getData(val, leaveIdx, breakpointidx, moststable, degeneps, upd, vec, lb, ub, FVEC,
                                  max);
         }

         --npassedBp;
      }

      ++npassedBp;
   }

   if(!foundStable)
   {
      assert(leaveIdx < 0);

      if(relax_count < SOPLEX_MAX_RELAX_COUNT)
      {
         SPxOut::debug(this, "DEBFRT04 {}: no valid leaveIdx found - relaxing...\n",
                       this->thesolver->basis().iteration());
         this->relax();
         ++relax_count;
         // restore original value
         val = max;
         // try again with relaxed delta
         return SPxBoundFlippingRT<R>::selectLeave(val, enterTest);
      }
      else
      {
         SPxOut::debug(this, "DEBFRT05 {}: no valid leaveIdx found - breaking...\n",
                       this->thesolver->basis().iteration());
         return leaveIdx;
      }
   }
   else
   {
      relax_count = 0;
      this->tighten();
   }

   // flip bounds of skipped breakpoints only if a nondegenerate step is to be performed
   if(npassedBp > 0 && spxAbs(breakpoints[npassedBp].val) > this->fastDelta)
   {
      flipAndUpdate(npassedBp);
      this->thesolver->boundflips = npassedBp;

      if(npassedBp >= 10)
         flipPotential = 1;
      else
         flipPotential -= 0.05;
   }
   else
   {
      this->thesolver->boundflips = 0;
      flipPotential -= 0.1;
   }

   SPxOut::debug(this, "DEBFRT06 {}: selected Index: {} number of candidates: {}\n",
                 this->thesolver->basis().iteration(), leaveIdx, nBp);

   return leaveIdx;
}